

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::TrackPid(ScriptContext *this,PropertyRecord *propertyRecord)

{
  ReferencedPropertyRecordHashSet *this_00;
  PropertyRecord *local_10;
  PropertyRecord *propertyRecord_local;
  
  if ((0x2d8 < propertyRecord->pid) && (propertyRecord->isBound == false)) {
    local_10 = propertyRecord;
    this_00 = JavascriptLibrary::EnsureReferencedPropertyRecordList
                        ((this->super_ScriptContextBase).javascriptLibrary);
    JsUtil::
    BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::AddNew(this_00,&local_10);
  }
  return;
}

Assistant:

void ScriptContext::TrackPid(const PropertyRecord* propertyRecord)
    {
        if (IsBuiltInPropertyId(propertyRecord->GetPropertyId()) || propertyRecord->IsBound())
        {
            return;
        }

        if (-1 != this->GetLibrary()->EnsureReferencedPropertyRecordList()->AddNew(propertyRecord))
        {
            RECYCLER_PERF_COUNTER_INC(PropertyRecordBindReference);
        }
    }